

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper(cmCommandArgumentParserHelper *this)

{
  cmCommandArgumentParserHelper *this_local;
  
  CleanupParser(this);
  std::__cxx11::string::~string((string *)&this->ErrorString);
  std::__cxx11::string::~string((string *)&this->Result);
  std::
  vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ::~vector(&this->Variables);
  std::vector<char,_std::allocator<char>_>::~vector(&this->OutputBuffer);
  return;
}

Assistant:

cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper()
{
  this->CleanupParser();
}